

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfCut.c
# Opt level: O2

Cnf_Cut_t * Cnf_CutCreate(Cnf_Man_t *p,Aig_Obj_t *pObj)

{
  uint uVar1;
  void *pvVar2;
  Cnf_Cut_t *pCVar3;
  ulong uVar4;
  char *__assertion;
  long lVar5;
  
  if (((uint)*(undefined8 *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assertion = "Aig_ObjIsNode(pObj)";
    uVar1 = 0x5c;
  }
  else {
    pvVar2 = (pObj->field_5).pData;
    for (lVar5 = 0;
        (uint)(byte)((ulong)*(undefined8 *)&pObj->field_0x18 >> 0x38) * 0x18 != (int)lVar5;
        lVar5 = lVar5 + 0x18) {
      uVar1 = *(uint *)((long)pvVar2 + lVar5 + 4);
      if ((~uVar1 & 0x18000000) == 0) {
        if (uVar1 < 0xa0000000) {
          pCVar3 = Cnf_CutAlloc(p,uVar1 >> 0x1d);
          memcpy(pCVar3 + 1,(void *)((long)pvVar2 + lVar5 + 8),
                 (ulong)(*(uint *)((long)pvVar2 + lVar5 + 4) >> 0x1b & 0xfffffffc));
          *(uint *)((long)pCVar3[1].vIsop + (long)pCVar3->nFanins * 4 + -8) =
               (uint)*(ushort *)((long)pvVar2 + lVar5 + 4) * 0x10001;
          uVar4 = (ulong)*(ushort *)((long)pvVar2 + lVar5 + 4);
          pCVar3->Cost = p->pSopSizes[uVar4 ^ 0xffff] + p->pSopSizes[uVar4];
          return pCVar3;
        }
        __assertion = "pCutBest->nLeaves <= 4";
        uVar1 = 0x5f;
        goto LAB_0043ffc4;
      }
    }
    __assertion = "pCutBest != NULL";
    uVar1 = 0x5e;
  }
LAB_0043ffc4:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfCut.c"
                ,uVar1,"Cnf_Cut_t *Cnf_CutCreate(Cnf_Man_t *, Aig_Obj_t *)");
}

Assistant:

Cnf_Cut_t * Cnf_CutCreate( Cnf_Man_t * p, Aig_Obj_t * pObj )
{
    Dar_Cut_t * pCutBest;
    Cnf_Cut_t * pCut;
    unsigned * pTruth;
    assert( Aig_ObjIsNode(pObj) );
    pCutBest = Dar_ObjBestCut( pObj );
    assert( pCutBest != NULL );
    assert( pCutBest->nLeaves <= 4 );
    pCut = Cnf_CutAlloc( p, pCutBest->nLeaves );
    memcpy( pCut->pFanins, pCutBest->pLeaves, sizeof(int) * pCutBest->nLeaves );
    pTruth = Cnf_CutTruth(pCut);
    *pTruth = (pCutBest->uTruth << 16) | pCutBest->uTruth;
    pCut->Cost = Cnf_CutSopCost( p, pCutBest );
    return pCut;
}